

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

ostream * gl4cts::anon_unknown_0::operator<<(ostream *stream,imageStoreCall *store)

{
  imageStoreCall *store_local;
  ostream *stream_local;
  
  std::operator<<(stream,"imageStore(");
  ImageLoadStoreMultipleUniformsTest::writeImageUniformNameToStream(stream,store->m_index);
  std::operator<<(stream,", ");
  ImageLoadStoreMultipleUniformsTest::writeCoordinatesVariableNameToStream
            (stream,store->m_index,store->m_row);
  if (store->m_row == 0) {
    std::operator<<(stream,", -");
  }
  else {
    std::operator<<(stream,", ");
  }
  ImageLoadStoreMultipleUniformsTest::writeLoadedValueVariableNameToStream(stream,store->m_index);
  std::operator<<(stream,");");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const imageStoreCall& store)
	{
		/* imageStore(u_image_0, row_0_coordinates_0, -loaded_value_0); */
		stream << "imageStore(";

		writeImageUniformNameToStream(stream, store.m_index);

		stream << ", ";

		writeCoordinatesVariableNameToStream(stream, store.m_index, store.m_row);

		if (0 == store.m_row)
		{
			stream << ", -";
		}
		else
		{
			stream << ", ";
		}

		writeLoadedValueVariableNameToStream(stream, store.m_index);
		stream << ");";

		return stream;
	}